

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

path * GetOutputFileName_abi_cxx11_(path *__return_storage_ptr__,char **p)

{
  delim_string_t str_name;
  delim_string_t local_60;
  path local_38;
  
  GetDelimitedStringEx_abi_cxx11_(&local_60,p);
  SJ_FixSlashes(&local_60,true);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_38,&local_60.first,auto_format);
  std::filesystem::__cxx11::operator/
            (__return_storage_ptr__,(path *)Options::OutPrefix_abi_cxx11_,&local_38);
  std::filesystem::__cxx11::path::~path(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
    operator_delete(local_60.first._M_dataplus._M_p,local_60.first.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path GetOutputFileName(char*& p) {
	auto str_name = GetDelimitedStringEx(p);	// read delimited filename string
	SJ_FixSlashes(str_name);					// convert backslashes *with* warning
	// prefix with output path and force slashes again (without warning)
	return SJ_force_slash(Options::OutPrefix / str_name.first);
}